

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* read_meminfo_abi_cxx11_(void)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  reference pcVar5;
  mapped_type *pmVar6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_290;
  char i;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined1 local_270 [4];
  int mem_size;
  string mem_name;
  string line;
  istream local_220 [8];
  ifstream fin;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *mem_map;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(in_RDI);
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,"/proc/meminfo",8);
  std::__cxx11::string::string((string *)(mem_name.field_2._M_local_buf + 8));
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (local_220,(string *)(mem_name.field_2._M_local_buf + 8));
    std::__cxx11::string::find((char)(&mem_name.field_2._M_allocated_capacity + 1),0x3a);
    std::__cxx11::string::substr
              ((ulong)local_270,(ulong)(&mem_name.field_2._M_allocated_capacity + 1));
    __range2._4_4_ = 0;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_290._M_current = (char *)std::__cxx11::string::end();
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffd70), bVar3) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar1 = *pcVar5;
      iVar4 = isdigit((int)cVar1);
      if (iVar4 != 0) {
        __range2._4_4_ = __range2._4_4_ * 10 + (int)cVar1 + -0x30;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    pmVar6 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](in_RDI,(key_type *)local_270);
    *pmVar6 = __range2._4_4_;
    std::__cxx11::string::~string((string *)local_270);
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)(mem_name.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_220);
  return in_RDI;
}

Assistant:

std::unordered_map<std::string, int>
read_meminfo() {
    std::unordered_map<std::string, int> mem_map;

    std::ifstream fin;
    fin.open("/proc/meminfo");
    std::string line;
    while (!fin.eof()) {
        getline(fin, line);

        std::string mem_name = line.substr(0, line.find(':'));
        int mem_size = 0;
        for (char i : line) {
            if (std::isdigit(i)) {
                mem_size = mem_size * 10 + i - 48;
            }
        }
        mem_map[mem_name] = mem_size;
    }
    fin.close();

    return mem_map;
}